

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_null_istream<char>::basic_null_istream(basic_null_istream<char> *this)

{
  undefined1 *this_00;
  
  this_00 = &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&this->field_0x128 = 0;
  *(undefined2 *)&this->field_0x130 = 0;
  *(undefined8 *)&this->field_0x138 = 0;
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)0xb2f3b0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50 = 0xb2f3d8;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._M_gcount = 0;
  std::ios::init((streambuf *)this_00);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)0xb2f360;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50 = 0xb2f388;
  *(code **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 = sysconf;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x18 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x20 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x28 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x30 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x38 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x40 = 0;
  std::locale::locale((locale *)
                      &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x48);
  *(undefined ***)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 =
       &PTR__streambuf_00b2f410;
  return;
}

Assistant:

basic_null_istream()
          : std::basic_istream<CharT>(&nb_)
        {
        }